

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon_label.c
# Opt level: O1

void JPCommonLabelWord_initialize
               (JPCommonLabelWord *w,char *pron,char *pos,char *ctype,char *cform,
               JPCommonLabelMora *head,JPCommonLabelMora *tail,JPCommonLabelWord *prev,
               JPCommonLabelWord *next)

{
  int iVar1;
  char *pcVar2;
  char **ppcVar3;
  long lVar4;
  
  pcVar2 = strdup(pron);
  w->pron = pcVar2;
  lVar4 = 1;
  ppcVar3 = jpcommon_pos_list;
  do {
    iVar1 = strcmp(*ppcVar3,pos);
    if (iVar1 == 0) goto LAB_0014cbe7;
    lVar4 = lVar4 + 2;
    ppcVar3 = ppcVar3 + 2;
  } while (lVar4 != 0x43);
  fprintf(_stderr,
          "WARNING: JPCommonLabelWord_initialize() in jpcommon_label.c: %s is unknown POS.\n",pos);
  lVar4 = 1;
LAB_0014cbe7:
  pcVar2 = strdup(jpcommon_pos_list[lVar4]);
  w->pos = pcVar2;
  lVar4 = 1;
  ppcVar3 = jpcommon_ctype_list;
  do {
    iVar1 = strcmp(*ppcVar3,ctype);
    if (iVar1 == 0) goto LAB_0014cc46;
    lVar4 = lVar4 + 2;
    ppcVar3 = ppcVar3 + 2;
  } while (lVar4 != 0x19);
  fprintf(_stderr,
          "WARNING: JPCommonLabelWord_initialize() in jpcommon_label.c: %s is unknown conjugation type.\n"
          ,ctype);
  lVar4 = 1;
LAB_0014cc46:
  pcVar2 = strdup(jpcommon_ctype_list[lVar4]);
  w->ctype = pcVar2;
  lVar4 = 1;
  ppcVar3 = jpcommon_cform_list;
  do {
    iVar1 = strcmp(*ppcVar3,cform);
    if (iVar1 == 0) goto LAB_0014cca5;
    lVar4 = lVar4 + 2;
    ppcVar3 = ppcVar3 + 2;
  } while (lVar4 != 0x11);
  fprintf(_stderr,
          "WARNING: JPCommonLabelWord_initialize() in jpcommon_label.c: %s is unknown conjugation form .\n"
          ,cform);
  lVar4 = 1;
LAB_0014cca5:
  pcVar2 = strdup(jpcommon_cform_list[lVar4]);
  w->cform = pcVar2;
  w->head = head;
  w->tail = tail;
  w->prev = prev;
  w->next = (_JPCommonLabelWord *)0x0;
  return;
}

Assistant:

static void JPCommonLabelWord_initialize(JPCommonLabelWord * w, const char *pron, const char *pos,
                                         const char *ctype, const char *cform,
                                         JPCommonLabelMora * head, JPCommonLabelMora * tail,
                                         JPCommonLabelWord * prev, JPCommonLabelWord * next)
{
   int i, find;

   w->pron = strdup(pron);
   for (i = 0, find = 0; jpcommon_pos_list[i] != NULL; i += 2) {
      if (strcmp(jpcommon_pos_list[i], pos) == 0) {
         find = 1;
         break;
      }
   }
   if (find == 0) {
      fprintf(stderr,
              "WARNING: JPCommonLabelWord_initialize() in jpcommon_label.c: %s is unknown POS.\n",
              pos);
      i = 0;
   }
   w->pos = strdup(jpcommon_pos_list[i + 1]);
   for (i = 0, find = 0; jpcommon_ctype_list[i] != NULL; i += 2) {
      if (strcmp(jpcommon_ctype_list[i], ctype) == 0) {
         find = 1;
         break;
      }
   }
   if (find == 0) {
      fprintf(stderr,
              "WARNING: JPCommonLabelWord_initialize() in jpcommon_label.c: %s is unknown conjugation type.\n",
              ctype);
      i = 0;
   }
   w->ctype = strdup(jpcommon_ctype_list[i + 1]);
   for (i = 0, find = 0; jpcommon_cform_list[i] != NULL; i += 2) {
      if (strcmp(jpcommon_cform_list[i], cform) == 0) {
         find = 1;
         break;
      }
   }
   if (find == 0) {
      fprintf(stderr,
              "WARNING: JPCommonLabelWord_initialize() in jpcommon_label.c: %s is unknown conjugation form .\n",
              cform);
      i = 0;
   }
   w->cform = strdup(jpcommon_cform_list[i + 1]);
   w->head = head;
   w->tail = tail;
   w->prev = prev;
   w->next = next;
}